

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end)

{
  int source_row;
  QAbstractItemModel *pQVar1;
  parameter_type pVar2;
  bool bVar3;
  undefined1 *puVar4;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar5;
  long in_FS_OFFSET;
  bool bVar6;
  undefined1 *local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  QAbstractItemModel *pQStack_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((source_parent->r < 0) || (source_parent->c < 0)) {
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
    ::value(&this->filter_recursive);
    bVar6 = true;
    bVar3 = false;
  }
  else {
    pQVar1 = (source_parent->m).ptr;
    pVar2 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
            ::value(&this->filter_recursive);
    bVar6 = pQVar1 == (QAbstractItemModel *)0x0;
    bVar3 = false;
    if ((!bVar6) && (bVar3 = false, pVar2)) {
      source_row = source_parent->r;
      pQVar1 = (source_parent->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_58 = (undefined1 *)0xffffffffffffffff;
        puStack_50 = (undefined1 *)0x0;
        local_48.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (*(pQVar1->super_QObject)._vptr_QObject[0xd])(&local_58,pQVar1,source_parent);
      }
      bVar3 = filterAcceptsRowInternal(this,source_row,(QModelIndex *)&local_58);
    }
  }
  pVar2 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
          ::value(&this->filter_recursive);
  if (((bVar6) || (bVar3 != false)) || (!pVar2)) {
    bVar6 = can_create_mapping(this,source_parent);
    if (bVar6) {
      create_mapping(this,source_parent);
    }
    pVar2 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
            ::value(&this->filter_recursive);
    if (pVar2) {
      this->complete_insert = true;
    }
    goto LAB_0047812c;
  }
  local_a8 = *(undefined1 **)source_parent;
  puVar4 = (undefined1 *)source_parent->i;
  tVar5.ptr = (source_parent->m).ptr;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  if (tVar5.ptr == (QAbstractItemModel *)0x0) {
LAB_00478100:
    local_78 = (undefined1 *)CONCAT44(0xffffffff,(int)local_78);
    puStack_70 = (undefined1 *)0x0;
    local_68.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (*((tVar5.ptr)->super_QObject)._vptr_QObject[0xd])(&local_58,tVar5.ptr,source_parent);
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    if (local_48.ptr == (QAbstractItemModel *)0x0) goto LAB_00478100;
    (*((local_48.ptr)->super_QObject)._vptr_QObject[0xd])(&local_78,local_48.ptr,&local_58);
    if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
       ((local_48.ptr != (QAbstractItemModel *)0x0 &&
        (bVar6 = filterAcceptsRowInternal(this,(int)local_58,(QModelIndex *)&local_78), !bVar6)))) {
      do {
        tVar5.ptr = local_48.ptr;
        puVar4 = puStack_50;
        local_a8 = local_58;
        local_58 = local_78;
        puStack_50 = puStack_70;
        local_48.ptr = local_68.ptr;
        if (local_68.ptr == (QAbstractItemModel *)0x0) {
          local_90 = (undefined1 *)0xffffffffffffffff;
          local_88 = (undefined1 *)0x0;
          pQStack_80 = (QAbstractItemModel *)0x0;
          bVar6 = false;
        }
        else {
          (*((local_68.ptr)->super_QObject)._vptr_QObject[0xd])(&local_90,local_68.ptr,&local_58);
          bVar6 = local_48.ptr != (QAbstractItemModel *)0x0;
        }
        local_68.ptr = pQStack_80;
        local_78 = local_90;
        puStack_70 = local_88;
      } while (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
              ((bVar6 && (bVar6 = filterAcceptsRowInternal
                                            (this,(int)local_58,(QModelIndex *)&local_78), !bVar6)))
              );
    }
  }
  *(undefined1 **)&this->last_top_source = local_a8;
  (this->last_top_source).i = (quintptr)puVar4;
  (this->last_top_source).m.ptr = tVar5.ptr;
LAB_0047812c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted(
    const QModelIndex &source_parent, int start, int end)
{
    Q_UNUSED(start);
    Q_UNUSED(end);

    const bool toplevel = !source_parent.isValid();
    const bool recursive_accepted = filter_recursive && !toplevel && filterAcceptsRowInternal(source_parent.row(), source_parent.parent());
    //Force the creation of a mapping now, even if it's empty.
    //We need it because the proxy can be accessed at the moment it emits rowsAboutToBeInserted in insert_source_items
    if (!filter_recursive || toplevel || recursive_accepted) {
        if (can_create_mapping(source_parent))
            create_mapping(source_parent);
        if (filter_recursive)
            complete_insert = true;
    } else {
        // The row could have been rejected or the parent might be not yet known... let's try to discover it
        QModelIndex top_source_parent = source_parent;
        QModelIndex parent = source_parent.parent();
        QModelIndex grandParent = parent.parent();

        while (parent.isValid() && !filterAcceptsRowInternal(parent.row(), grandParent)) {
            top_source_parent = parent;
            parent = grandParent;
            grandParent = parent.parent();
        }

        last_top_source = top_source_parent;
    }
}